

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::Dump(Node *this,StreamWriterLE *outstream,bool binary,int indent)

{
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  int indent_local;
  bool binary_local;
  StreamWriterLE *outstream_local;
  Node *this_local;
  
  if (binary) {
    DumpBinary(this,outstream);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    DumpAscii(this,(ostream *)local_198,indent);
    std::__cxx11::ostringstream::str();
    StreamWriter<false,_false>::PutString(outstream,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void FBX::Node::Dump(
    Assimp::StreamWriterLE &outstream,
    bool binary, int indent
) {
    if (binary) {
        DumpBinary(outstream);
    } else {
        std::ostringstream ss;
        DumpAscii(ss, indent);
        outstream.PutString(ss.str());
    }
}